

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmres.hpp
# Opt level: O1

void __thiscall Gmres::gmres(Gmres *this,double *x,double *b_vec)

{
  uint16_t uVar1;
  ushort uVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  bool bVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  ushort uVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  int iVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  
  (**this->_vptr_Gmres)(this,this->v_mat,x);
  uVar1 = this->len;
  lVar7 = (long)(short)uVar1;
  dVar20 = 0.0;
  if (0 < lVar7) {
    pdVar3 = this->v_mat;
    lVar10 = 0;
    do {
      pdVar3[lVar10] = b_vec[lVar10] - pdVar3[lVar10];
      lVar10 = lVar10 + 1;
    } while (lVar7 != lVar10);
    dVar20 = 0.0;
    if (0 < (short)uVar1) {
      lVar10 = 0;
      do {
        dVar20 = dVar20 + pdVar3[lVar10] * pdVar3[lVar10];
        lVar10 = lVar10 + 1;
      } while (lVar7 != lVar10);
    }
  }
  if (dVar20 < 0.0) {
    dVar20 = sqrt(dVar20);
  }
  else {
    dVar20 = SQRT(dVar20);
  }
  *this->rho_e_vec = dVar20;
  if (this->tol <= dVar20) {
    uVar1 = this->len;
    if (0 < (long)(short)uVar1) {
      pdVar3 = this->v_mat;
      lVar7 = 0;
      do {
        pdVar3[lVar7] = pdVar3[lVar7] * (1.0 / dVar20);
        lVar7 = lVar7 + 1;
      } while ((short)uVar1 != lVar7);
    }
    if (this->k_max == 0) {
      uVar8 = 0;
    }
    else {
      lVar7 = 1;
      uVar12 = 0;
      uVar8 = 0;
      do {
        iVar19 = (int)uVar8;
        uVar11 = uVar8 + 1;
        (**this->_vptr_Gmres)(this,this->v_mat + uVar11 * this->len,this->v_mat + this->len * uVar8)
        ;
        uVar15 = this->len;
        uVar13 = (ulong)uVar15;
        uVar2 = this->k_max;
        pdVar3 = this->v_mat;
        pdVar4 = this->h_mat;
        pdVar5 = this->U_buf;
        iVar9 = (int)lVar7;
        uVar14 = (uint)uVar15 * iVar9 & 0xffff;
        uVar16 = 0;
        lVar10 = 0;
        do {
          dVar20 = 0.0;
          if (0 < (short)uVar15) {
            uVar18 = 0;
            do {
              dVar20 = dVar20 + pdVar3[(uVar16 & 0xffff) + uVar18] * pdVar3[uVar14 + uVar18];
              uVar18 = uVar18 + 1;
            } while (uVar13 != uVar18);
          }
          pdVar4[(uVar2 + 1) * iVar19 + (int)lVar10 & 0xffff] = dVar20;
          if (0 < (short)uVar15) {
            uVar18 = 0;
            do {
              pdVar5[uVar18] = pdVar3[(uVar16 & 0xffff) + uVar18] * dVar20;
              uVar18 = uVar18 + 1;
            } while (uVar13 != uVar18);
            if (0 < (short)uVar15) {
              uVar18 = 0;
              do {
                pdVar3[uVar14 + uVar18] = pdVar3[uVar14 + uVar18] - pdVar5[uVar18];
                uVar18 = uVar18 + 1;
              } while (uVar13 != uVar18);
            }
          }
          lVar10 = lVar10 + 1;
          uVar16 = uVar16 + uVar15;
        } while (lVar10 != lVar7);
        uVar2 = this->k_max;
        if ((short)uVar15 < 1) {
          dVar20 = 0.0;
        }
        else {
          dVar20 = 0.0;
          uVar18 = 0;
          do {
            dVar20 = dVar20 + this->v_mat[(iVar9 * (uint)uVar15 & 0xffff) + uVar18] *
                              this->v_mat[(iVar9 * (uint)uVar15 & 0xffff) + uVar18];
            uVar18 = uVar18 + 1;
          } while (uVar13 != uVar18);
        }
        if (dVar20 < 0.0) {
          dVar20 = sqrt(dVar20);
        }
        else {
          dVar20 = SQRT(dVar20);
        }
        pdVar3 = this->h_mat;
        pdVar3[((ulong)uVar2 + 1) * uVar8 + uVar11 & 0xffff] = dVar20;
        if (ABS(dVar20) < 2.220446049250313e-16) {
          puts("Breakdown");
          return;
        }
        uVar1 = this->len;
        if (0 < (long)(short)uVar1) {
          pdVar4 = this->v_mat;
          uVar14 = iVar9 * (uint)uVar15 & 0xffff;
          lVar10 = 0;
          do {
            pdVar4[(ulong)uVar14 + lVar10] = pdVar4[(ulong)uVar14 + lVar10] * (1.0 / dVar20);
            lVar10 = lVar10 + 1;
          } while ((short)uVar1 != lVar10);
        }
        if (uVar8 != 0) {
          pdVar4 = this->g_vec;
          uVar14 = (this->k_max + 1) * iVar19;
          uVar13 = 0;
          do {
            uVar18 = uVar13 & 0xffff;
            uVar17 = (ulong)(uVar14 & 0xffff);
            dVar20 = -(pdVar4[uVar18] * pdVar3[uVar17] + pdVar4[uVar18 + 1] * pdVar3[uVar17 + 1]) *
                     pdVar4[uVar18 + 2];
            pdVar3[uVar17] = pdVar4[uVar18] * dVar20 + pdVar3[uVar17];
            pdVar3[uVar17 + 1] = dVar20 * pdVar4[uVar18 + 1] + pdVar3[uVar17 + 1];
            uVar14 = uVar14 + 1;
            uVar13 = uVar13 + 3;
          } while (uVar12 != uVar13);
        }
        iVar9 = this->k_max + 2;
        uVar13 = (ulong)(iVar19 * iVar9 & 0xffff);
        dVar20 = pdVar3[uVar13];
        dVar21 = 0.0;
        lVar10 = 0;
        do {
          dVar21 = dVar21 + pdVar3[(ulong)(iVar9 * iVar19 & 0xffff) + lVar10] *
                            pdVar3[(ulong)(iVar9 * iVar19 & 0xffff) + lVar10];
          lVar10 = lVar10 + 1;
        } while (lVar10 != 2);
        if (dVar21 < 0.0) {
          dVar21 = sqrt(dVar21);
        }
        else {
          dVar21 = SQRT(dVar21);
        }
        dVar22 = 0.0;
        dVar20 = (double)(~-(ulong)(dVar20 < 0.0) & (ulong)-dVar21 |
                         -(ulong)(dVar20 < 0.0) & (ulong)dVar21);
        pdVar3 = this->h_mat;
        pdVar4 = this->g_vec;
        uVar18 = (ulong)(iVar19 * 3 & 0xffff);
        pdVar4[uVar18] = pdVar3[uVar13] - dVar20;
        pdVar4[uVar18 + 1] = pdVar3[uVar13 + 1];
        lVar10 = 0;
        do {
          dVar21 = *(double *)((long)pdVar4 + lVar10 * 8 + (ulong)(((uint)uVar12 & 0xffff) << 3));
          dVar22 = dVar22 + dVar21 * dVar21;
          lVar10 = lVar10 + 1;
        } while (lVar10 != 2);
        pdVar4[uVar18 + 2] = 2.0 / dVar22;
        pdVar3[uVar13] = dVar20;
        pdVar3[uVar13 + 1] = 0.0;
        pdVar3 = this->rho_e_vec;
        dVar20 = -pdVar4[uVar18] * pdVar3[uVar8] * pdVar4[uVar18 + 2];
        pdVar3[uVar8] = pdVar4[uVar18] * dVar20 + pdVar3[uVar8];
        dVar20 = dVar20 * pdVar4[uVar18 + 1];
        pdVar3[uVar11] = dVar20;
        if (ABS(dVar20) < this->tol) goto LAB_00104838;
        lVar7 = lVar7 + 1;
        uVar12 = uVar12 + 3;
        uVar8 = uVar11;
      } while (uVar11 < this->k_max);
      uVar8 = (ulong)(iVar19 + 1);
    }
LAB_00104838:
    uVar15 = (short)uVar8 - 1;
    if (-1 < (short)uVar15) {
      pdVar3 = this->h_mat;
      pdVar4 = this->rho_e_vec;
      uVar2 = this->k_max;
      uVar11 = (ulong)uVar15;
      uVar14 = (int)uVar8 + (uVar2 + 1) * (uint)uVar15;
      uVar12 = uVar11;
      do {
        uVar14 = uVar14 - 1;
        if ((long)uVar12 < (long)uVar11) {
          dVar20 = pdVar4[uVar12];
          uVar13 = uVar11;
          uVar16 = uVar14;
          do {
            uVar18 = (ulong)uVar16;
            uVar16 = uVar16 + ~(uint)uVar2;
            dVar20 = dVar20 - pdVar3[uVar18 & 0xffff] * pdVar4[uVar13];
            pdVar4[uVar12] = dVar20;
            uVar13 = uVar13 - 1;
          } while ((long)uVar12 < (long)uVar13);
        }
        pdVar4[uVar12] = pdVar4[uVar12] / pdVar3[(uVar2 + 2) * (int)uVar12 & 0xffff];
        bVar6 = 0 < (long)uVar12;
        uVar12 = uVar12 - 1;
      } while (bVar6);
    }
    pdVar4 = this->v_mat;
    pdVar5 = this->rho_e_vec;
    uVar15 = this->len;
    uVar12 = (ulong)uVar15;
    pdVar3 = pdVar4 + this->k_max * uVar12;
    if (pdVar3 == pdVar5) {
      printf("%s pointer error !\n","mul");
      exit(-1);
    }
    if (0 < (short)uVar15) {
      memset(pdVar3,0,(ulong)((uint)uVar15 * 8));
    }
    if (0 < (short)uVar8) {
      lVar7 = 0;
      uVar11 = 0;
      do {
        if (0 < (short)uVar15) {
          uVar13 = 0;
          do {
            pdVar3[uVar13] =
                 pdVar4[(short)((short)lVar7 + (short)uVar13)] * pdVar5[uVar11] + pdVar3[uVar13];
            uVar13 = uVar13 + 1;
          } while (uVar12 != uVar13);
        }
        uVar11 = uVar11 + 1;
        lVar7 = lVar7 + uVar12;
      } while (uVar11 != (uVar8 & 0xffff));
    }
    if (0 < (short)uVar15) {
      uVar8 = 0;
      do {
        x[uVar8] = x[uVar8] + pdVar3[uVar8];
        uVar8 = uVar8 + 1;
      } while (uVar12 != uVar8);
    }
  }
  return;
}

Assistant:

void gmres(double *x, const double *b_vec) {
    uint16_t k, idx_v1, idx_v2, idx_h, idx_g;
    double buf;

    // r0 = b - Ax(x0)
    Ax_func(&v_mat[0], x);
    sub(&v_mat[0], b_vec, &v_mat[0], len);

    // rho = sqrt(r0' * r0)
    rho_e_vec[0] = norm(&v_mat[0], len);

    if (rho_e_vec[0] < tol) {
      return;
    }

    // v(0) = r0 / rho
    div(&v_mat[0], &v_mat[0], rho_e_vec[0], len);

    for (k = 0; k < k_max; k++) {
      // v(k + 1) = Ax(v(k))
      Ax_func(&v_mat[len * (k + 1)], &v_mat[len * k]);

      idx_v1 = len * (k + 1);
      // Modified Gram-Schmidt
      for (uint16_t i = 0; i < k + 1; i++) {
        idx_v2 = len * i;
        idx_h = (k_max + 1) * k + i;
        h_mat[idx_h] = dot(&v_mat[idx_v2], &v_mat[idx_v1], len);
        mul(U_buf, &v_mat[idx_v2], h_mat[idx_h], len);
        sub(&v_mat[idx_v1], &v_mat[idx_v1], U_buf, len);
      }
      idx_h = (k_max + 1) * k + (k + 1);
      h_mat[idx_h] = norm(&v_mat[idx_v1], len);

      // Check breakdown
      if (fabs(h_mat[idx_h]) < DBL_EPSILON) {
        printf("Breakdown\n");
        return;
      } else {
        div(&v_mat[idx_v1], &v_mat[idx_v1], h_mat[idx_h], len);
      }

      // Transformation h_mat to upper triangular matrix by Householder transformation
      for (uint16_t i = 0; i < k; i++) {
        idx_h = (k_max + 1) * k + i;
        idx_g = g_vec_len * i;
        buf = (g_vec[idx_g + 0] * h_mat[idx_h + 0] + g_vec[idx_g + 1] * h_mat[idx_h + 1]) * g_vec[idx_g + 2];
        h_mat[idx_h + 0] = h_mat[idx_h + 0] - buf * g_vec[idx_g + 0];
        h_mat[idx_h + 1] = h_mat[idx_h + 1] - buf * g_vec[idx_g + 1];
      }
      idx_h = (k_max + 1) * k + k;
      idx_g = g_vec_len * k;
      buf = -sign(h_mat[idx_h]) * norm(&h_mat[idx_h], 2);  // Vector length
      g_vec[idx_g + 0] = h_mat[idx_h + 0] - buf;
      g_vec[idx_g + 1] = h_mat[idx_h + 1];
      g_vec[idx_g + 2] = 2.0 / dot(&g_vec[idx_g], &g_vec[idx_g], 2);
      h_mat[idx_h + 0] = buf;
      h_mat[idx_h + 1] = 0.0;

      // Update residual
      buf = g_vec[idx_g + 0] * rho_e_vec[k + 0] * g_vec[idx_g + 2];
      rho_e_vec[k + 0] = rho_e_vec[k + 0] - buf * g_vec[idx_g + 0];
      rho_e_vec[k + 1] = -buf * g_vec[idx_g + 1];

      // Check convergence
      if (fabs(rho_e_vec[k + 1]) < tol) {
        break;
      }
    }

    // Solve h_mat * y = rho_e_vec
    // h_mat is upper triangle matrix
    for (int16_t i = k - 1; i >= 0; i--) {
      for (int16_t j = k - 1; j > i; j--) {
        idx_h = (k_max + 1) * j + i;
        rho_e_vec[i] -= h_mat[idx_h] * rho_e_vec[j];
      }
      idx_h = (k_max + 1) * i + i;
      rho_e_vec[i] /= h_mat[idx_h];
    }

    // x = x + v_mat * y
    mul(&v_mat[len * k_max], v_mat, rho_e_vec, len, k);
    add(x, x, &v_mat[len * k_max], len);
  }